

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmDestroySourceFile(void *arg)

{
  cmCPluginAPISourceFile *sf;
  
  if (*arg != 0) {
    return;
  }
  cmCPluginAPISourceFile::~cmCPluginAPISourceFile((cmCPluginAPISourceFile *)arg);
  operator_delete(arg,0xb8);
  return;
}

Assistant:

static void CCONV cmDestroySourceFile(void* arg)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  // Only delete if it was created by cmCreateSourceFile or
  // cmCreateNewSourceFile and is therefore not in the map.
  if (!sf->RealSourceFile) {
    delete sf;
  }
}